

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::TreeNodeBehavior(ImGuiID id,ImGuiTreeNodeFlags flags,char *label,char *label_end)

{
  ImVec2 pos;
  ImVec2 pos_00;
  ImVec2 pos_01;
  ImVec2 IVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  ImU32 fill_col;
  ImVec2 *in_RCX;
  ImVec2 *in_RDX;
  uint in_ESI;
  ImGuiID in_EDI;
  bool bVar5;
  bool bVar6;
  float fVar7;
  float fVar8;
  float dir;
  ImU32 bg_col_1;
  ImU32 bg_col;
  ImGuiNavHighlightFlags nav_highlight_flags;
  ImU32 text_col;
  bool toggled;
  bool pressed;
  bool held;
  bool hovered;
  bool was_selected;
  bool selected;
  bool is_mouse_x_over_arrow;
  float arrow_hit_x2;
  float arrow_hit_x1;
  ImGuiButtonFlags button_flags;
  bool item_add;
  bool is_open;
  bool is_leaf;
  ImRect interact_bb;
  ImVec2 text_pos;
  float text_width;
  float text_offset_y;
  float text_offset_x;
  ImRect frame_bb;
  float frame_height;
  ImVec2 label_size;
  ImVec2 padding;
  bool display_frame;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  undefined4 in_stack_fffffffffffffe90;
  ImGuiID in_stack_fffffffffffffe94;
  ImDrawList *in_stack_fffffffffffffe98;
  ImVec2 in_stack_fffffffffffffea0;
  ImVec2 IVar9;
  float in_stack_fffffffffffffea8;
  float in_stack_fffffffffffffeac;
  ImVec2 *in_stack_fffffffffffffeb0;
  ImRect *in_stack_fffffffffffffeb8;
  ImGuiStorage *in_stack_fffffffffffffec0;
  ImVec2 *text_size_if_known;
  ImDrawList *in_stack_fffffffffffffec8;
  undefined1 hide_text_after_hash;
  ImDrawList *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 uVar10;
  undefined2 in_stack_fffffffffffffedc;
  byte in_stack_fffffffffffffede;
  undefined1 uVar11;
  float id_00;
  float fVar12;
  float in_stack_fffffffffffffef4;
  ImVec2 local_100;
  ImVec2 local_f8;
  undefined8 local_f0;
  undefined8 in_stack_ffffffffffffff18;
  float rounding;
  undefined1 in_stack_ffffffffffffff23;
  ImU32 in_stack_ffffffffffffff24;
  ImVec2 in_stack_ffffffffffffff28;
  ImVec2 in_stack_ffffffffffffff30;
  float in_stack_ffffffffffffff38;
  float in_stack_ffffffffffffff3c;
  ImRect *in_stack_ffffffffffffff40;
  ImRect *bb;
  byte local_a1;
  byte local_a0;
  bool local_8e;
  ImVec2 local_7c;
  ImVec2 local_74;
  float local_6c;
  float local_68;
  float local_64;
  float local_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float local_50;
  ImVec2 local_4c;
  ImVec2 local_44;
  byte local_39;
  ImGuiStyle *local_38;
  ImGuiContext *local_30;
  ImGuiWindow *local_28;
  ImVec2 *local_20;
  ImVec2 *local_18;
  uint local_c;
  ImGuiID local_8;
  bool local_1;
  
  rounding = (float)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_EDI;
  local_28 = GetCurrentWindow();
  if ((local_28->SkipItems & 1U) == 0) {
    local_30 = GImGui;
    local_38 = &GImGui->Style;
    local_39 = (local_c & 2) != 0;
    if (((bool)local_39) || ((local_c & 0x400) != 0)) {
      local_44 = (GImGui->Style).FramePadding;
    }
    else {
      in_stack_fffffffffffffef4 = (GImGui->Style).FramePadding.x;
      fVar7 = ImMin<float>((local_28->DC).CurrLineTextBaseOffset,(GImGui->Style).FramePadding.y);
      ImVec2::ImVec2(&local_44,in_stack_fffffffffffffef4,fVar7);
    }
    if (local_20 == (ImVec2 *)0x0) {
      local_20 = (ImVec2 *)FindRenderedTextEnd((char *)local_18,(char *)0x0);
    }
    local_4c = CalcTextSize((char *)in_stack_fffffffffffffeb8,(char *)in_stack_fffffffffffffeb0,
                            SUB41((uint)in_stack_fffffffffffffeac >> 0x18,0),
                            in_stack_fffffffffffffea8);
    fVar7 = (local_38->FramePadding).y;
    fVar7 = ImMin<float>((local_28->DC).CurrLineSize.y,fVar7 + fVar7 + local_30->FontSize);
    local_50 = ImMax<float>(fVar7,local_44.y + local_44.y + local_4c.y);
    ImRect::ImRect((ImRect *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    if ((local_c & 0x1000) == 0) {
      fVar7 = (local_28->DC).CursorPos.x;
    }
    else {
      fVar7 = (local_28->WorkRect).Min.x;
    }
    fStack_5c = (local_28->DC).CursorPos.y;
    local_58 = (local_28->WorkRect).Max.x;
    fStack_54 = (local_28->DC).CursorPos.y + local_50;
    local_60 = fVar7;
    if ((local_39 & 1) != 0) {
      local_60 = fVar7 - (float)(int)((local_28->WindowPadding).x * 0.5 + -1.0);
      local_58 = (float)(int)((local_28->WindowPadding).x * 0.5) + local_58;
    }
    fVar12 = local_30->FontSize;
    if ((local_39 & 1) == 0) {
      fVar8 = local_44.x * 2.0;
    }
    else {
      fVar8 = local_44.x * 3.0;
    }
    local_64 = fVar12 + fVar8;
    local_68 = ImMax<float>(local_44.y,(local_28->DC).CurrLineTextBaseOffset);
    id_00 = local_30->FontSize;
    if (local_4c.x <= 0.0) {
      dir = 0.0;
    }
    else {
      dir = local_44.x + local_44.x + local_4c.x;
    }
    local_6c = id_00 + dir;
    ImVec2::ImVec2(&local_74,(local_28->DC).CursorPos.x + local_64,
                   (local_28->DC).CursorPos.y + local_68);
    ImVec2::ImVec2(&local_7c,local_6c,local_50);
    ItemSize(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
    bVar5 = (local_c & 0x100) != 0;
    local_8e = TreeNodeBehaviorIsOpen
                         ((ImGuiID)in_stack_fffffffffffffeb0,
                          (ImGuiTreeNodeFlags)in_stack_fffffffffffffeac);
    if ((((local_8e) && ((local_30->NavIdIsAlive & 1U) == 0)) && ((local_c & 0x2000) != 0)) &&
       ((local_c & 8) == 0)) {
      (local_28->DC).TreeJumpToParentOnPopMask =
           1 << ((byte)(local_28->DC).TreeDepth & 0x1f) | (local_28->DC).TreeJumpToParentOnPopMask;
    }
    bVar2 = ItemAdd(in_stack_fffffffffffffeb8,(ImGuiID)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                    (ImRect *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    (local_28->DC).LastItemStatusFlags = (local_28->DC).LastItemStatusFlags | 2;
    IVar9.y = fStack_5c;
    IVar9.x = local_60;
    (local_28->DC).LastItemDisplayRect.Min = IVar9;
    IVar1.y = fStack_54;
    IVar1.x = local_58;
    (local_28->DC).LastItemDisplayRect.Max = IVar1;
    if (bVar2) {
      bVar2 = false;
      if ((local_74.x - local_64) - (local_38->TouchExtraPadding).x <= (local_30->IO).MousePos.x) {
        bVar2 = (local_30->IO).MousePos.x <
                (local_74.x - local_64) + local_44.x + local_44.x + local_30->FontSize +
                (local_38->TouchExtraPadding).x;
      }
      uVar4 = local_c & 1;
      uVar11 = bVar2;
      bVar3 = ButtonBehavior((ImRect *)CONCAT44(fVar12,fVar8),(ImGuiID)id_00,
                             (bool *)CONCAT17(bVar2,CONCAT16(in_stack_fffffffffffffede,
                                                             CONCAT24(in_stack_fffffffffffffedc,
                                                                      in_stack_fffffffffffffed8))),
                             (bool *)in_stack_fffffffffffffed0,
                             (ImGuiButtonFlags)((ulong)in_stack_fffffffffffffec8 >> 0x20));
      bVar6 = false;
      if (!bVar5) {
        if ((bVar3) && (local_30->DragDropHoldJustPressedId != local_8)) {
          if (((local_c & 0xc0) == 0) || (local_30->NavActivateId == local_8)) {
            bVar6 = true;
          }
          if ((local_c & 0x80) != 0) {
            in_stack_fffffffffffffede = 0;
            if (bVar2 != false) {
              in_stack_fffffffffffffede = local_30->NavDisableMouseHover ^ 0xff;
            }
            bVar6 = bVar6 || (in_stack_fffffffffffffede & 1) != 0;
          }
          if (((local_c & 0x40) != 0) && (((local_30->IO).MouseDoubleClicked[0] & 1U) != 0)) {
            bVar6 = true;
          }
        }
        else if ((bVar3) && (local_30->DragDropHoldJustPressedId == local_8)) {
          bVar6 = !local_8e;
        }
        if ((((local_30->NavId == local_8) && ((local_30->NavMoveRequest & 1U) != 0)) &&
            (local_30->NavMoveDir == 0)) && (local_8e)) {
          bVar6 = true;
          NavMoveRequestCancel();
        }
        if (((local_30->NavId == local_8) && ((local_30->NavMoveRequest & 1U) != 0)) &&
           ((local_30->NavMoveDir == 1 && (!local_8e)))) {
          bVar6 = true;
          NavMoveRequestCancel();
        }
        if (bVar6) {
          local_8e = (bool)((local_8e ^ 0xffU) & 1);
          ImGuiStorage::SetInt
                    (in_stack_fffffffffffffec0,(ImGuiID)((ulong)in_stack_fffffffffffffeb8 >> 0x20),
                     (int)in_stack_fffffffffffffeb8);
          (local_28->DC).LastItemStatusFlags = (local_28->DC).LastItemStatusFlags | 0x10;
        }
      }
      if ((local_c & 4) != 0) {
        SetItemAllowOverlap();
      }
      GetColorU32((ImGuiCol)in_stack_fffffffffffffea0.y,in_stack_fffffffffffffea0.x);
      if ((local_39 & 1) == 0) {
        if (((local_a0 & 1) != 0) || (uVar4 != 0)) {
          fill_col = GetColorU32((ImGuiCol)in_stack_fffffffffffffea0.y,in_stack_fffffffffffffea0.x);
          local_f0 = CONCAT44(fStack_54,local_58);
          RenderFrame(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,fill_col,
                      (bool)in_stack_ffffffffffffff23,fStack_5c);
          RenderNavHighlight(in_stack_ffffffffffffff40,(ImGuiID)in_stack_ffffffffffffff3c,
                             (ImGuiNavHighlightFlags)in_stack_ffffffffffffff38);
        }
        hide_text_after_hash = (undefined1)((ulong)in_stack_fffffffffffffec8 >> 0x38);
        if ((local_c & 0x200) == 0) {
          if (!bVar5) {
            ImVec2::ImVec2(&local_100,(local_74.x - local_64) + local_44.x,
                           local_30->FontSize * 0.15 + local_74.y);
            pos_01.y = in_stack_fffffffffffffef4;
            pos_01.x = fVar7;
            RenderArrow((ImDrawList *)CONCAT44(fVar12,fVar8),pos_01,(ImU32)id_00,(ImGuiDir)dir,
                        (float)CONCAT13(uVar11,CONCAT12(in_stack_fffffffffffffede,
                                                        in_stack_fffffffffffffedc)));
          }
        }
        else {
          IVar9 = (ImVec2)local_28->DrawList;
          ImVec2::ImVec2(&local_f8,local_74.x - local_64 * 0.5,local_30->FontSize * 0.5 + local_74.y
                        );
          RenderBullet(in_stack_fffffffffffffe98,IVar9,in_stack_fffffffffffffe94);
        }
        if ((local_30->LogEnabled & 1U) != 0) {
          LogSetNextTextDecoration(">",(char *)0x0);
        }
        pos.y = id_00;
        pos.x = dir;
        RenderText(pos,(char *)CONCAT17(uVar11,CONCAT16(in_stack_fffffffffffffede,
                                                        CONCAT24(in_stack_fffffffffffffedc,
                                                                 in_stack_fffffffffffffed8))),
                   (char *)in_stack_fffffffffffffed0,(bool)hide_text_after_hash);
      }
      else {
        if (((local_a1 & 1) == 0) || ((local_a0 & 1) == 0)) {
          uVar10 = 0x18;
          if ((local_a0 & 1) != 0) {
            uVar10 = 0x19;
          }
        }
        else {
          uVar10 = 0x1a;
        }
        GetColorU32((ImGuiCol)in_stack_fffffffffffffea0.y,in_stack_fffffffffffffea0.x);
        bb = (ImRect *)CONCAT44(fStack_54,local_58);
        RenderFrame(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,
                    (bool)in_stack_ffffffffffffff23,rounding);
        RenderNavHighlight(bb,(ImGuiID)in_stack_ffffffffffffff3c,
                           (ImGuiNavHighlightFlags)in_stack_ffffffffffffff38);
        if ((local_c & 0x200) == 0) {
          if (bVar5) {
            local_74.x = local_74.x - local_64;
          }
          else {
            in_stack_fffffffffffffec8 = local_28->DrawList;
            ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff30,(local_74.x - local_64) + local_44.x,
                           local_74.y);
            pos_00.y = in_stack_fffffffffffffef4;
            pos_00.x = fVar7;
            RenderArrow((ImDrawList *)CONCAT44(fVar12,fVar8),pos_00,(ImU32)id_00,(ImGuiDir)dir,
                        (float)CONCAT13(uVar11,CONCAT12(in_stack_fffffffffffffede,
                                                        in_stack_fffffffffffffedc)));
          }
        }
        else {
          in_stack_fffffffffffffed0 = local_28->DrawList;
          ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff38,local_74.x + local_64 * -0.6,
                         local_30->FontSize * 0.5 + local_74.y);
          RenderBullet(in_stack_fffffffffffffe98,in_stack_fffffffffffffea0,in_stack_fffffffffffffe94
                      );
        }
        if ((local_c & 0x100000) != 0) {
          local_58 = local_58 - (local_30->FontSize + (local_38->FramePadding).x);
        }
        if ((local_30->LogEnabled & 1U) != 0) {
          LogSetNextTextDecoration("###","###");
        }
        text_size_if_known = local_20;
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff28,0.0,0.0);
        RenderTextClipped((ImVec2 *)CONCAT44(id_00,dir),
                          (ImVec2 *)
                          CONCAT17(uVar11,CONCAT16(in_stack_fffffffffffffede,
                                                   CONCAT24(in_stack_fffffffffffffedc,uVar10))),
                          (char *)in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8,
                          text_size_if_known,local_18,
                          (ImRect *)CONCAT44(in_stack_fffffffffffffef4,fVar7));
      }
      if ((local_8e != false) && ((local_c & 8) == 0)) {
        TreePushOverrideID(in_stack_fffffffffffffe94);
      }
      local_1 = local_8e;
    }
    else {
      local_1 = local_8e;
      if ((local_8e) && ((local_c & 8) == 0)) {
        TreePushOverrideID(in_stack_fffffffffffffe94);
      }
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::TreeNodeBehavior(ImGuiID id, ImGuiTreeNodeFlags flags, const char* label, const char* label_end)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const bool display_frame = (flags & ImGuiTreeNodeFlags_Framed) != 0;
    const ImVec2 padding = (display_frame || (flags & ImGuiTreeNodeFlags_FramePadding)) ? style.FramePadding : ImVec2(style.FramePadding.x, ImMin(window->DC.CurrLineTextBaseOffset, style.FramePadding.y));

    if (!label_end)
        label_end = FindRenderedTextEnd(label);
    const ImVec2 label_size = CalcTextSize(label, label_end, false);

    // We vertically grow up to current line height up the typical widget height.
    const float frame_height = ImMax(ImMin(window->DC.CurrLineSize.y, g.FontSize + style.FramePadding.y * 2), label_size.y + padding.y * 2);
    ImRect frame_bb;
    frame_bb.Min.x = (flags & ImGuiTreeNodeFlags_SpanFullWidth) ? window->WorkRect.Min.x : window->DC.CursorPos.x;
    frame_bb.Min.y = window->DC.CursorPos.y;
    frame_bb.Max.x = window->WorkRect.Max.x;
    frame_bb.Max.y = window->DC.CursorPos.y + frame_height;
    if (display_frame)
    {
        // Framed header expand a little outside the default padding, to the edge of InnerClipRect
        // (FIXME: May remove this at some point and make InnerClipRect align with WindowPadding.x instead of WindowPadding.x*0.5f)
        frame_bb.Min.x -= IM_FLOOR(window->WindowPadding.x * 0.5f - 1.0f);
        frame_bb.Max.x += IM_FLOOR(window->WindowPadding.x * 0.5f);
    }

    const float text_offset_x = g.FontSize + (display_frame ? padding.x * 3 : padding.x * 2);           // Collapser arrow width + Spacing
    const float text_offset_y = ImMax(padding.y, window->DC.CurrLineTextBaseOffset);                    // Latch before ItemSize changes it
    const float text_width = g.FontSize + (label_size.x > 0.0f ? label_size.x + padding.x * 2 : 0.0f);  // Include collapser
    ImVec2 text_pos(window->DC.CursorPos.x + text_offset_x, window->DC.CursorPos.y + text_offset_y);
    ItemSize(ImVec2(text_width, frame_height), padding.y);

    // For regular tree nodes, we arbitrary allow to click past 2 worth of ItemSpacing
    ImRect interact_bb = frame_bb;
    if (!display_frame && (flags & (ImGuiTreeNodeFlags_SpanAvailWidth | ImGuiTreeNodeFlags_SpanFullWidth)) == 0)
        interact_bb.Max.x = frame_bb.Min.x + text_width + style.ItemSpacing.x * 2.0f;

    // Store a flag for the current depth to tell if we will allow closing this node when navigating one of its child.
    // For this purpose we essentially compare if g.NavIdIsAlive went from 0 to 1 between TreeNode() and TreePop().
    // This is currently only support 32 level deep and we are fine with (1 << Depth) overflowing into a zero.
    const bool is_leaf = (flags & ImGuiTreeNodeFlags_Leaf) != 0;
    bool is_open = TreeNodeBehaviorIsOpen(id, flags);
    if (is_open && !g.NavIdIsAlive && (flags & ImGuiTreeNodeFlags_NavLeftJumpsBackHere) && !(flags & ImGuiTreeNodeFlags_NoTreePushOnOpen))
        window->DC.TreeJumpToParentOnPopMask |= (1 << window->DC.TreeDepth);

    bool item_add = ItemAdd(interact_bb, id);
    window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_HasDisplayRect;
    window->DC.LastItemDisplayRect = frame_bb;

    if (!item_add)
    {
        if (is_open && !(flags & ImGuiTreeNodeFlags_NoTreePushOnOpen))
            TreePushOverrideID(id);
        IMGUI_TEST_ENGINE_ITEM_INFO(window->DC.LastItemId, label, window->DC.ItemFlags | (is_leaf ? 0 : ImGuiItemStatusFlags_Openable) | (is_open ? ImGuiItemStatusFlags_Opened : 0));
        return is_open;
    }

    ImGuiButtonFlags button_flags = ImGuiTreeNodeFlags_None;
    if (flags & ImGuiTreeNodeFlags_AllowItemOverlap)
        button_flags |= ImGuiButtonFlags_AllowItemOverlap;
    if (!is_leaf)
        button_flags |= ImGuiButtonFlags_PressedOnDragDropHold;

    // We allow clicking on the arrow section with keyboard modifiers held, in order to easily
    // allow browsing a tree while preserving selection with code implementing multi-selection patterns.
    // When clicking on the rest of the tree node we always disallow keyboard modifiers.
    const float arrow_hit_x1 = (text_pos.x - text_offset_x) - style.TouchExtraPadding.x;
    const float arrow_hit_x2 = (text_pos.x - text_offset_x) + (g.FontSize + padding.x * 2.0f) + style.TouchExtraPadding.x;
    const bool is_mouse_x_over_arrow = (g.IO.MousePos.x >= arrow_hit_x1 && g.IO.MousePos.x < arrow_hit_x2);
    if (window != g.HoveredWindow || !is_mouse_x_over_arrow)
        button_flags |= ImGuiButtonFlags_NoKeyModifiers;

    // Open behaviors can be altered with the _OpenOnArrow and _OnOnDoubleClick flags.
    // Some alteration have subtle effects (e.g. toggle on MouseUp vs MouseDown events) due to requirements for multi-selection and drag and drop support.
    // - Single-click on label = Toggle on MouseUp (default, when _OpenOnArrow=0)
    // - Single-click on arrow = Toggle on MouseDown (when _OpenOnArrow=0)
    // - Single-click on arrow = Toggle on MouseDown (when _OpenOnArrow=1)
    // - Double-click on label = Toggle on MouseDoubleClick (when _OpenOnDoubleClick=1)
    // - Double-click on arrow = Toggle on MouseDoubleClick (when _OpenOnDoubleClick=1 and _OpenOnArrow=0)
    // It is rather standard that arrow click react on Down rather than Up.
    // We set ImGuiButtonFlags_PressedOnClickRelease on OpenOnDoubleClick because we want the item to be active on the initial MouseDown in order for drag and drop to work.
    if (is_mouse_x_over_arrow)
        button_flags |= ImGuiButtonFlags_PressedOnClick;
    else if (flags & ImGuiTreeNodeFlags_OpenOnDoubleClick)
        button_flags |= ImGuiButtonFlags_PressedOnClickRelease | ImGuiButtonFlags_PressedOnDoubleClick;
    else
        button_flags |= ImGuiButtonFlags_PressedOnClickRelease;

    bool selected = (flags & ImGuiTreeNodeFlags_Selected) != 0;
    const bool was_selected = selected;

    bool hovered, held;
    bool pressed = ButtonBehavior(interact_bb, id, &hovered, &held, button_flags);
    bool toggled = false;
    if (!is_leaf)
    {
        if (pressed && g.DragDropHoldJustPressedId != id)
        {
            if ((flags & (ImGuiTreeNodeFlags_OpenOnArrow | ImGuiTreeNodeFlags_OpenOnDoubleClick)) == 0 || (g.NavActivateId == id))
                toggled = true;
            if (flags & ImGuiTreeNodeFlags_OpenOnArrow)
                toggled |= is_mouse_x_over_arrow && !g.NavDisableMouseHover; // Lightweight equivalent of IsMouseHoveringRect() since ButtonBehavior() already did the job
            if ((flags & ImGuiTreeNodeFlags_OpenOnDoubleClick) && g.IO.MouseDoubleClicked[0])
                toggled = true;
        }
        else if (pressed && g.DragDropHoldJustPressedId == id)
        {
            IM_ASSERT(button_flags & ImGuiButtonFlags_PressedOnDragDropHold);
            if (!is_open) // When using Drag and Drop "hold to open" we keep the node highlighted after opening, but never close it again.
                toggled = true;
        }

        if (g.NavId == id && g.NavMoveRequest && g.NavMoveDir == ImGuiDir_Left && is_open)
        {
            toggled = true;
            NavMoveRequestCancel();
        }
        if (g.NavId == id && g.NavMoveRequest && g.NavMoveDir == ImGuiDir_Right && !is_open) // If there's something upcoming on the line we may want to give it the priority?
        {
            toggled = true;
            NavMoveRequestCancel();
        }

        if (toggled)
        {
            is_open = !is_open;
            window->DC.StateStorage->SetInt(id, is_open);
            window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_ToggledOpen;
        }
    }
    if (flags & ImGuiTreeNodeFlags_AllowItemOverlap)
        SetItemAllowOverlap();

    // In this branch, TreeNodeBehavior() cannot toggle the selection so this will never trigger.
    if (selected != was_selected) //-V547
        window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_ToggledSelection;

    // Render
    const ImU32 text_col = GetColorU32(ImGuiCol_Text);
    ImGuiNavHighlightFlags nav_highlight_flags = ImGuiNavHighlightFlags_TypeThin;
    if (display_frame)
    {
        // Framed type
        const ImU32 bg_col = GetColorU32((held && hovered) ? ImGuiCol_HeaderActive : hovered ? ImGuiCol_HeaderHovered : ImGuiCol_Header);
        RenderFrame(frame_bb.Min, frame_bb.Max, bg_col, true, style.FrameRounding);
        RenderNavHighlight(frame_bb, id, nav_highlight_flags);
        if (flags & ImGuiTreeNodeFlags_Bullet)
            RenderBullet(window->DrawList, ImVec2(text_pos.x - text_offset_x * 0.60f, text_pos.y + g.FontSize * 0.5f), text_col);
        else if (!is_leaf)
            RenderArrow(window->DrawList, ImVec2(text_pos.x - text_offset_x + padding.x, text_pos.y), text_col, is_open ? ImGuiDir_Down : ImGuiDir_Right, 1.0f);
        else // Leaf without bullet, left-adjusted text
            text_pos.x -= text_offset_x;
        if (flags & ImGuiTreeNodeFlags_ClipLabelForTrailingButton)
            frame_bb.Max.x -= g.FontSize + style.FramePadding.x;

        if (g.LogEnabled)
            LogSetNextTextDecoration("###", "###");
        RenderTextClipped(text_pos, frame_bb.Max, label, label_end, &label_size);
    }
    else
    {
        // Unframed typed for tree nodes
        if (hovered || selected)
        {
            const ImU32 bg_col = GetColorU32((held && hovered) ? ImGuiCol_HeaderActive : hovered ? ImGuiCol_HeaderHovered : ImGuiCol_Header);
            RenderFrame(frame_bb.Min, frame_bb.Max, bg_col, false);
            RenderNavHighlight(frame_bb, id, nav_highlight_flags);
        }
        if (flags & ImGuiTreeNodeFlags_Bullet)
            RenderBullet(window->DrawList, ImVec2(text_pos.x - text_offset_x * 0.5f, text_pos.y + g.FontSize * 0.5f), text_col);
        else if (!is_leaf)
            RenderArrow(window->DrawList, ImVec2(text_pos.x - text_offset_x + padding.x, text_pos.y + g.FontSize * 0.15f), text_col, is_open ? ImGuiDir_Down : ImGuiDir_Right, 0.70f);
        if (g.LogEnabled)
            LogSetNextTextDecoration(">", NULL);
        RenderText(text_pos, label, label_end, false);
    }

    if (is_open && !(flags & ImGuiTreeNodeFlags_NoTreePushOnOpen))
        TreePushOverrideID(id);
    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, window->DC.ItemFlags | (is_leaf ? 0 : ImGuiItemStatusFlags_Openable) | (is_open ? ImGuiItemStatusFlags_Opened : 0));
    return is_open;
}